

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

ByteData256 * __thiscall
cfd::core::ConfidentialTransaction::GetElementsSignatureHash
          (ByteData256 *__return_storage_ptr__,ConfidentialTransaction *this,uint32_t txin_index,
          ByteData *script_data,SigHashType *sighash_type,ConfidentialValue *value,
          WitnessVersion version)

{
  wally_tx *tx;
  ByteData256 *pBVar1;
  pointer puVar2;
  pointer script;
  bool bVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t sighash;
  uchar *puVar6;
  CfdException *pCVar7;
  value_type_conflict *__val;
  int ret;
  undefined1 local_d8 [32];
  wally_tx *tx_pointer;
  uint32_t local_ac;
  ByteData256 *local_a8;
  uchar *local_a0;
  SigHashType *local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_98 = sighash_type;
  bVar3 = ByteData::IsEmpty(script_data);
  if (bVar3) {
    local_d8._0_8_ = "cfdcore_elements_transaction.cpp";
    local_d8._8_4_ = 0xbed;
    local_d8._16_8_ = "GetElementsSignatureHash";
    logger::log<>((CfdSourceLocation *)local_d8,kCfdLogLevelWarning,"empty script");
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    local_d8._0_8_ = local_d8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"Failed to GetSignatureHash. empty script.","");
    CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_d8);
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
  puVar6 = (uchar *)operator_new(0x20);
  local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar6 + 0x20;
  puVar6[0x10] = '\0';
  puVar6[0x11] = '\0';
  puVar6[0x12] = '\0';
  puVar6[0x13] = '\0';
  puVar6[0x14] = '\0';
  puVar6[0x15] = '\0';
  puVar6[0x16] = '\0';
  puVar6[0x17] = '\0';
  puVar6[0x18] = '\0';
  puVar6[0x19] = '\0';
  puVar6[0x1a] = '\0';
  puVar6[0x1b] = '\0';
  puVar6[0x1c] = '\0';
  puVar6[0x1d] = '\0';
  puVar6[0x1e] = '\0';
  puVar6[0x1f] = '\0';
  puVar6[0] = '\0';
  puVar6[1] = '\0';
  puVar6[2] = '\0';
  puVar6[3] = '\0';
  puVar6[4] = '\0';
  puVar6[5] = '\0';
  puVar6[6] = '\0';
  puVar6[7] = '\0';
  puVar6[8] = '\0';
  puVar6[9] = '\0';
  puVar6[10] = '\0';
  puVar6[0xb] = '\0';
  puVar6[0xc] = '\0';
  puVar6[0xd] = '\0';
  puVar6[0xe] = '\0';
  puVar6[0xf] = '\0';
  local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar6;
  local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  ByteData::GetBytes(&local_48,script_data);
  tx_pointer = (wally_tx *)0x0;
  uVar4 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[7])(this);
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xd])
            (local_d8,this,(ulong)(uVar4 & 0xff));
  ByteData::GetBytes(&local_60,(ByteData *)local_d8);
  local_ac = txin_index;
  local_a0 = puVar6;
  if ((pointer)local_d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_d8._0_8_);
  }
  puVar2 = local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[9])(this);
  ret = wally_tx_from_bytes(puVar2,(long)local_60.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2,
                            uVar5,&tx_pointer);
  if ((ret == 0) && (tx_pointer != (wally_tx *)0x0)) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8,
               &(value->data_).data_);
    ByteData::GetBytes(&local_78,(ByteData *)local_d8);
    local_a8 = __return_storage_ptr__;
    if ((pointer)local_d8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_d8._0_8_);
    }
    if (version == kVersionNone) {
      uVar5 = 0;
    }
    else {
      uVar4 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[9])(this);
      uVar5 = uVar4 & 1;
    }
    script = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    tx = tx_pointer;
    sighash = SigHashType::GetSigHashFlag(local_98);
    ret = wally_tx_get_elements_signature_hash
                    (tx,(ulong)local_ac,script,
                     (long)local_48.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)script,puVar2,
                     (long)local_78.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)puVar2,sighash,uVar5,local_a0,
                     0x20);
    wally_tx_free(tx_pointer);
    if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    pBVar1 = local_a8;
    if (ret == 0) {
      ByteData256::ByteData256(local_a8,&local_90);
      if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return pBVar1;
    }
    local_d8._0_8_ = "cfdcore_elements_transaction.cpp";
    local_d8._8_4_ = 0xc16;
    local_d8._16_8_ = "GetElementsSignatureHash";
    logger::log<int&>((CfdSourceLocation *)local_d8,kCfdLogLevelWarning,
                      "wally_tx_get_elements_signature_hash NG[{}] ",&ret);
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    local_d8._0_8_ = local_d8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"SignatureHash generate error.","");
    CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_d8);
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_d8._0_8_ = "cfdcore_elements_transaction.cpp";
  local_d8._8_4_ = 0xbfc;
  local_d8._16_8_ = "GetElementsSignatureHash";
  logger::log<int&>((CfdSourceLocation *)local_d8,kCfdLogLevelWarning,"wally_tx_from_bytes NG[{}] ",
                    &ret);
  pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
  local_d8._0_8_ = local_d8 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,"transaction data invalid.","");
  CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_d8);
  __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData256 ConfidentialTransaction::GetElementsSignatureHash(
    uint32_t txin_index, const ByteData &script_data, SigHashType sighash_type,
    const ConfidentialValue &value, WitnessVersion version) const {
  if (script_data.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "empty script");
    throw CfdException(
        kCfdIllegalArgumentError, "Failed to GetSignatureHash. empty script.");
  }
  std::vector<uint8_t> buffer(SHA256_LEN);
  const std::vector<uint8_t> &bytes = script_data.GetBytes();
  struct wally_tx *tx_pointer = NULL;
  int ret;

  // Change AbstractTransaction to wally_tx
  const std::vector<uint8_t> &tx_bytedata =
      GetByteData(HasWitness()).GetBytes();
  ret = wally_tx_from_bytes(
      tx_bytedata.data(), tx_bytedata.size(), GetWallyFlag(), &tx_pointer);
  if (ret != WALLY_OK || tx_pointer == NULL) {
    warn(CFD_LOG_SOURCE, "wally_tx_from_bytes NG[{}] ", ret);
    throw CfdException(kCfdIllegalArgumentError, "transaction data invalid.");
  }

  // Calculate signature hash
  try {
    const std::vector<uint8_t> &value_data = value.GetData().GetBytes();
    uint32_t tx_flag = 0;
    if (version != WitnessVersion::kVersionNone) {
      tx_flag = GetWallyFlag() & WALLY_TX_FLAG_USE_WITNESS;
    }
    ret = wally_tx_get_elements_signature_hash(
        tx_pointer, txin_index, bytes.data(), bytes.size(), value_data.data(),
        value_data.size(), sighash_type.GetSigHashFlag(), tx_flag,
        buffer.data(), buffer.size());
    wally_tx_free(tx_pointer);
  } catch (...) {
    wally_tx_free(tx_pointer);
    warn(
        CFD_LOG_SOURCE, "wally_tx_get_elements_signature_hash exception[{}] ",
        ret);
    throw CfdException(
        kCfdIllegalArgumentError, "SignatureHash generate error.");
  }

  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_elements_signature_hash NG[{}] ", ret);
    throw CfdException(
        kCfdIllegalArgumentError, "SignatureHash generate error.");
  }
  return ByteData256(buffer);
}